

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_registry.c
# Opt level: O0

upb_MiniTableExtension *
upb_ExtensionRegistry_Lookup(upb_ExtensionRegistry *r,upb_MiniTable *t,uint32_t num)

{
  _Bool _Var1;
  upb_value local_38;
  upb_value v;
  char buf [12];
  uint32_t num_local;
  upb_MiniTable *t_local;
  upb_ExtensionRegistry *r_local;
  
  extreg_key((char *)&v,t,num);
  _Var1 = upb_strtable_lookup2(&r->exts,(char *)&v,0xc,&local_38);
  if (_Var1) {
    r_local = (upb_ExtensionRegistry *)upb_value_getconstptr(local_38);
  }
  else {
    r_local = (upb_ExtensionRegistry *)0x0;
  }
  return (upb_MiniTableExtension *)r_local;
}

Assistant:

const upb_MiniTableExtension* upb_ExtensionRegistry_Lookup(
    const upb_ExtensionRegistry* r, const upb_MiniTable* t, uint32_t num) {
  char buf[EXTREG_KEY_SIZE];
  upb_value v;
  extreg_key(buf, t, num);
  if (upb_strtable_lookup2(&r->exts, buf, EXTREG_KEY_SIZE, &v)) {
    return upb_value_getconstptr(v);
  } else {
    return NULL;
  }
}